

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O0

uint obmc_sad(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int width,int height)

{
  int iVar1;
  uint sad;
  int x;
  int y;
  int height_local;
  int width_local;
  int32_t *mask_local;
  int32_t *wsrc_local;
  int pre_stride_local;
  uint8_t *pre_local;
  
  sad = 0;
  mask_local = mask;
  wsrc_local = wsrc;
  pre_local = pre;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = wsrc_local[x] - (uint)pre_local[x] * mask_local[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = (iVar1 + 0x800 >> 0xc) + sad;
    }
    pre_local = pre_local + pre_stride;
    wsrc_local = wsrc_local + width;
    mask_local = mask_local + width;
  }
  return sad;
}

Assistant:

static inline unsigned int obmc_sad(const uint8_t *pre, int pre_stride,
                                    const int32_t *wsrc, const int32_t *mask,
                                    int width, int height) {
  int y, x;
  unsigned int sad = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++)
      sad += ROUND_POWER_OF_TWO(abs(wsrc[x] - pre[x] * mask[x]), 12);

    pre += pre_stride;
    wsrc += width;
    mask += width;
  }

  return sad;
}